

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t icu_63::CollationRuleParser::getReorderCode(char *word)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0x1000;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x14) {
      uVar2 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,word);
      if ((int)uVar2 < 0) {
        iVar3 = uprv_stricmp_63(word,"others");
        uVar2 = -(uint)(iVar3 != 0) | 0x67;
      }
      return uVar2;
    }
    iVar1 = uprv_stricmp_63(word,(char *)((long)&_ZN6icu_63L20gSpecialReorderCodesE_rel +
                                         (long)*(int *)((long)&
                                                  _ZN6icu_63L20gSpecialReorderCodesE_rel + lVar4)));
    if (iVar1 == 0) break;
    lVar4 = lVar4 + 4;
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int32_t
CollationRuleParser::getReorderCode(const char *word) {
    for(int32_t i = 0; i < UPRV_LENGTHOF(gSpecialReorderCodes); ++i) {
        if(uprv_stricmp(word, gSpecialReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    int32_t script = u_getPropertyValueEnum(UCHAR_SCRIPT, word);
    if(script >= 0) {
        return script;
    }
    if(uprv_stricmp(word, "others") == 0) {
        return UCOL_REORDER_CODE_OTHERS;  // same as Zzzz = USCRIPT_UNKNOWN
    }
    return -1;
}